

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAligned(SerialArena *this,size_t n)

{
  bool bVar1;
  size_t in_RSI;
  SerialArena *in_RDI;
  void *ret;
  SerialArena *in_stack_ffffffffffffff50;
  char *local_8;
  
  bVar1 = HasSpace(in_RDI,in_RSI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_8 = in_RDI->ptr_;
    in_RDI->ptr_ = in_RDI->ptr_ + in_RSI;
  }
  else {
    local_8 = (char *)AllocateAlignedFallback(in_stack_ffffffffffffff50,(size_t)in_RDI);
  }
  return local_8;
}

Assistant:

void* AllocateAligned(size_t n) {
    GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
    GOOGLE_DCHECK_GE(limit_, ptr_);
    if (PROTOBUF_PREDICT_FALSE(!HasSpace(n))) {
      return AllocateAlignedFallback(n);
    }
    void* ret = ptr_;
    ptr_ += n;
#ifdef ADDRESS_SANITIZER
    ASAN_UNPOISON_MEMORY_REGION(ret, n);
#endif  // ADDRESS_SANITIZER
    return ret;
  }